

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O0

void do_cmd_wiz_curse_item(command_conflict *cmd)

{
  _Bool _Var1;
  wchar_t wVar2;
  int local_7c;
  char local_78 [4];
  wchar_t update;
  char s [80];
  wchar_t local_20;
  wchar_t local_1c;
  wchar_t power;
  wchar_t curse_index;
  object *obj;
  command_conflict *cmd_local;
  
  obj = (object *)cmd;
  wVar2 = cmd_get_arg_item((command *)cmd,"item",(object **)&power);
  if (wVar2 != L'\0') {
    _Var1 = get_item((object **)&power,"Change curse on which item? ","You have nothing to change.",
                     *(cmd_code *)((long)&obj->kind + 4),(item_tester)0x0,L'\x0f');
    if (!_Var1) {
      return;
    }
    cmd_set_arg_item((command *)obj,"item",_power);
  }
  wVar2 = cmd_get_arg_number((command *)obj,"index",&local_1c);
  if (wVar2 != L'\0') {
    strnfmt(local_78,0x50,"0");
    _Var1 = get_string("Enter curse name or index: ",local_78,0x50);
    if (!_Var1) {
      return;
    }
    _Var1 = get_int_from_string(local_78,&local_1c);
    if (!_Var1) {
      local_1c = lookup_curse(local_78);
    }
    cmd_set_arg_number((command *)obj,"index",local_1c);
  }
  if ((L'\0' < local_1c) && (local_1c < (int)(uint)z_info->curse_max)) {
    wVar2 = cmd_get_arg_number((command *)obj,"power",&local_20);
    if (wVar2 != L'\0') {
      strnfmt(local_78,0x50,"0");
      _Var1 = get_string("Enter curse power (0 removes): ",local_78,0x50);
      if (!_Var1) {
        return;
      }
      _Var1 = get_int_from_string(local_78,&local_20);
      if (!_Var1) {
        return;
      }
      cmd_set_arg_number((command *)obj,"power",local_20);
    }
    if (L'\xffffffff' < local_20) {
      if (local_20 == L'\0') {
        _Var1 = remove_object_curse(_power,local_1c,false);
        if (!_Var1) {
          return;
        }
      }
      else {
        append_object_curse(_power,local_1c,local_20);
      }
      local_7c = 0;
      wVar2 = cmd_get_arg_choice((command *)obj,"update",&local_7c);
      if ((wVar2 == L'\0') && (local_7c == 0)) {
        wiz_play_item_notify_changed();
      }
      else {
        wiz_play_item_standard_upkeep(player,_power);
      }
    }
  }
  return;
}

Assistant:

void do_cmd_wiz_curse_item(struct command *cmd)
{
	struct object *obj;
	int curse_index, power;
	char s[80];
	int update;

	if (cmd_get_arg_item(cmd, "item", &obj) != CMD_OK) {
		if (!get_item(&obj, "Change curse on which item? ",
				"You have nothing to change.", cmd->code,
				NULL, (USE_EQUIP | USE_INVEN | USE_QUIVER |
				USE_FLOOR))) {
			return;
		}
		cmd_set_arg_item(cmd, "item", obj);
	}

	/* Get curse. */
	if (cmd_get_arg_number(cmd, "index", &curse_index) != CMD_OK) {
		strnfmt(s, sizeof(s), "0");
		if (!get_string("Enter curse name or index: ",
				s, sizeof(s))) return;
		if (!get_int_from_string(s, &curse_index)) {
			curse_index = lookup_curse(s);
		}
		cmd_set_arg_number(cmd, "index", curse_index);
	}
	if (curse_index <= 0 || curse_index >= z_info->curse_max) {
		return;
	}

	/* Get power for curse. */
	if (cmd_get_arg_number(cmd, "power", &power) != CMD_OK) {
		strnfmt(s, sizeof(s), "0");
		if (!get_string("Enter curse power (0 removes): ", s,
				sizeof(s)) || !get_int_from_string(s, &power)) {
			return;
		}
		cmd_set_arg_number(cmd, "power", power);
	}
	if (power < 0) {
		return;
	}

	/* Apply. */
	if (power) {
		append_object_curse(obj, curse_index, power);
	} else if (!remove_object_curse(obj, curse_index, false)) {
		return;
	}

	update = 0;
	if (cmd_get_arg_choice(cmd, "update", &update) != CMD_OK || update) {
		wiz_play_item_standard_upkeep(player, obj);
	} else {
		wiz_play_item_notify_changed();
	}
}